

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O3

_Bool queue_dequeue(queue_t *queue,qdata_t *data)

{
  qnode_t *__ptr;
  _Bool _Var1;
  qnode_t *pqVar2;
  
  _Var1 = false;
  if (((queue != (queue_t *)0x0) && (data != (qdata_t *)0x0)) && (_Var1 = false, queue->len != 0)) {
    __ptr = queue->head;
    *data = __ptr->data;
    if (queue->len == 1) {
      queue->tail = (qnode_t *)0x0;
      pqVar2 = (qnode_t *)0x0;
    }
    else {
      pqVar2 = queue->head->next;
    }
    queue->head = pqVar2;
    free(__ptr);
    queue->len = queue->len - 1;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool queue_dequeue(queue_t *queue, qdata_t *data)
{
    bool status = false;
    qnode_t *node = NULL;

    if (queue == NULL || queue->len == 0 || data == NULL) {
        goto EXIT;
    }

    node = queue->head;
    *data = node->data;

    if (queue->len == 1) {
        queue->head = NULL;
        queue->tail = NULL;
    } else {
        queue->head = queue->head->next;
    }

    qnode_destroy(node);
    --queue->len;
    status = true;

EXIT:
    return status;
}